

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O2

Expression * __thiscall
slang::ast::Expression::PropagationVisitor::visit<slang::ast::InsideExpression>
          (PropagationVisitor *this,InsideExpression *expr)

{
  Type *this_00;
  bool bVar1;
  Type *rhs;
  Expression *pEVar2;
  SourceLocation loc;
  Type *local_28;
  Type *local_20;
  
  bVar1 = bad(&expr->super_Expression);
  if (!bVar1) {
    bVar1 = Type::isError(this->newType);
    if (bVar1) {
      local_28 = this->newType;
      not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                ((not_null<slang::ast::Type_const*> *)&local_20,&local_28);
      (expr->super_Expression).type.ptr = local_20;
    }
    else {
      this_00 = this->newType;
      rhs = not_null<const_slang::ast::Type_*>::get(&(expr->super_Expression).type);
      bVar1 = Type::isEquivalent(this_00,rhs);
      if (!bVar1) {
        loc = this->assignmentLoc;
        bVar1 = ((ulong)loc & 0xfffffff) == 0;
        if (bVar1) {
          loc = (expr->super_Expression).sourceRange.startLoc;
        }
        pEVar2 = ConversionExpression::makeImplicit
                           (this->context,this->newType,(uint)bVar1,&expr->super_Expression,loc);
        return pEVar2;
      }
    }
  }
  return &expr->super_Expression;
}

Assistant:

Expression& visit(T& expr) {
        if (expr.bad())
            return expr;

        if (newType.isError()) {
            expr.type = &newType;
            return expr;
        }

        // If the new type is equivalent to the old type, there's no need for a
        // conversion. Otherwise if both types are integral or both are real, we have to
        // check if the conversion should be pushed further down the tree. Otherwise we
        // should insert the implicit conversion here.
        bool needConversion = !newType.isEquivalent(*expr.type);
        if constexpr (is_detected_v<propagate_t, T, const ASTContext&, const Type&>) {
            if ((newType.isFloating() && expr.type->isFloating()) ||
                (newType.isIntegral() && expr.type->isIntegral()) || newType.isString() ||
                expr.kind == ExpressionKind::OpenRange) {

                if (expr.propagateType(context, newType))
                    needConversion = false;
            }
        }

        Expression* result = &expr;
        if (needConversion) {
            if (assignmentLoc) {
                result = &ConversionExpression::makeImplicit(context, newType,
                                                             ConversionKind::Implicit, expr,
                                                             assignmentLoc);
            }
            else {
                result = &ConversionExpression::makeImplicit(context, newType,
                                                             ConversionKind::Propagated, expr,
                                                             expr.sourceRange.start());
            }
        }

        return *result;
    }